

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::SkipField
               (CodedInputStream *input,uint32 tag,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  WireType WVar3;
  uint32 uVar4;
  CodedInputStream *input_00;
  uint32 in_ESI;
  CodedInputStream *in_RDI;
  uint32 value_2;
  string temp;
  uint32 length;
  uint64 value_1;
  uint64 value;
  uint64 *in_stack_ffffffffffffff70;
  CodedInputStream *in_stack_ffffffffffffff78;
  string *str;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  uint64 *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  string local_58 [2];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar5;
  
  iVar2 = GetTagFieldNumber(in_ESI);
  if (iVar2 == 0) {
    bVar5 = 0;
  }
  else {
    WVar3 = GetTagWireType(in_ESI);
    input_00 = (CodedInputStream *)(ulong)WVar3;
    switch(input_00) {
    case (CodedInputStream *)0x0:
      bVar1 = io::CodedInputStream::ReadVarint64
                        ((CodedInputStream *)
                         CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff90);
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32
                  ((CodedOutputStream *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                   (uint32)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        io::CodedOutputStream::WriteVarint64
                  ((CodedOutputStream *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                   (uint64)in_stack_ffffffffffffff78);
        bVar5 = 1;
      }
      else {
        bVar5 = 0;
      }
      break;
    case (CodedInputStream *)0x1:
      bVar1 = io::CodedInputStream::ReadLittleEndian64
                        (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32
                  ((CodedOutputStream *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                   (uint32)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        io::CodedOutputStream::WriteLittleEndian64
                  ((CodedOutputStream *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                   (uint64)in_stack_ffffffffffffff78);
        bVar5 = 1;
      }
      else {
        bVar5 = 0;
      }
      break;
    case (CodedInputStream *)0x2:
      bVar1 = io::CodedInputStream::ReadVarint32
                        (input_00,(uint32 *)
                                  CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
      uVar4 = (uint32)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32
                  ((CodedOutputStream *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),uVar4);
        io::CodedOutputStream::WriteVarint32
                  ((CodedOutputStream *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),uVar4);
        str = local_58;
        std::__cxx11::string::string((string *)str);
        bVar5 = io::CodedInputStream::ReadString
                          ((CodedInputStream *)
                           CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           (string *)in_RDI,in_ESI);
        if ((bool)bVar5) {
          io::CodedOutputStream::WriteString
                    ((CodedOutputStream *)CONCAT17(bVar5,in_stack_ffffffffffffff80),str);
        }
        std::__cxx11::string::~string((string *)local_58);
      }
      else {
        bVar5 = 0;
      }
      break;
    case (CodedInputStream *)0x3:
      io::CodedOutputStream::WriteVarint32
                ((CodedOutputStream *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                 (uint32)((ulong)in_stack_ffffffffffffff78 >> 0x20));
      bVar1 = io::CodedInputStream::IncrementRecursionDepth(in_RDI);
      if (bVar1) {
        bVar1 = SkipMessage(input_00,(CodedOutputStream *)
                                     CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
        if (bVar1) {
          io::CodedInputStream::DecrementRecursionDepth(in_RDI);
          iVar2 = GetTagFieldNumber(in_ESI);
          uVar4 = MakeTag(iVar2,WIRETYPE_END_GROUP);
          bVar1 = io::CodedInputStream::LastTagWas(in_RDI,uVar4);
          if (bVar1) {
            bVar5 = 1;
          }
          else {
            bVar5 = 0;
          }
        }
        else {
          bVar5 = 0;
        }
      }
      else {
        bVar5 = 0;
      }
      break;
    case (CodedInputStream *)0x4:
      bVar5 = 0;
      break;
    case (CodedInputStream *)0x5:
      bVar1 = io::CodedInputStream::ReadLittleEndian32
                        (in_stack_ffffffffffffff78,(uint32 *)in_stack_ffffffffffffff70);
      uVar4 = (uint32)((ulong)in_stack_ffffffffffffff78 >> 0x20);
      if (bVar1) {
        io::CodedOutputStream::WriteVarint32
                  ((CodedOutputStream *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),uVar4);
        io::CodedOutputStream::WriteLittleEndian32
                  ((CodedOutputStream *)
                   CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),uVar4);
        bVar5 = 1;
      }
      else {
        bVar5 = 0;
      }
      break;
    default:
      bVar5 = 0;
    }
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool WireFormatLite::SkipField(io::CodedInputStream* input, uint32 tag,
                               io::CodedOutputStream* output) {
  // Field number 0 is illegal.
  if (WireFormatLite::GetTagFieldNumber(tag) == 0) return false;
  switch (WireFormatLite::GetTagWireType(tag)) {
    case WireFormatLite::WIRETYPE_VARINT: {
      uint64 value;
      if (!input->ReadVarint64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_FIXED64: {
      uint64 value;
      if (!input->ReadLittleEndian64(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian64(value);
      return true;
    }
    case WireFormatLite::WIRETYPE_LENGTH_DELIMITED: {
      uint32 length;
      if (!input->ReadVarint32(&length)) return false;
      output->WriteVarint32(tag);
      output->WriteVarint32(length);
      // TODO(mkilavuz): Provide API to prevent extra string copying.
      std::string temp;
      if (!input->ReadString(&temp, length)) return false;
      output->WriteString(temp);
      return true;
    }
    case WireFormatLite::WIRETYPE_START_GROUP: {
      output->WriteVarint32(tag);
      if (!input->IncrementRecursionDepth()) return false;
      if (!SkipMessage(input, output)) return false;
      input->DecrementRecursionDepth();
      // Check that the ending tag matched the starting tag.
      if (!input->LastTagWas(
              WireFormatLite::MakeTag(WireFormatLite::GetTagFieldNumber(tag),
                                      WireFormatLite::WIRETYPE_END_GROUP))) {
        return false;
      }
      return true;
    }
    case WireFormatLite::WIRETYPE_END_GROUP: {
      return false;
    }
    case WireFormatLite::WIRETYPE_FIXED32: {
      uint32 value;
      if (!input->ReadLittleEndian32(&value)) return false;
      output->WriteVarint32(tag);
      output->WriteLittleEndian32(value);
      return true;
    }
    default: {
      return false;
    }
  }
}